

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaWildcardPtr
xmlSchemaParseAnyAttribute(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  _xmlAttr *p_Var1;
  int iVar2;
  char *in_RAX;
  xmlSchemaPtr schema_00;
  xmlSchemaAnnotPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr pxVar5;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  
  if ((node != (xmlNodePtr)0x0) &&
     (pxVar4 = node,
     schema_00 = (xmlSchemaPtr)xmlSchemaAddWildcard(ctxt,schema,XML_SCHEMA_TYPE_ANY_ATTRIBUTE,node),
     schema_00 != (xmlSchemaPtr)0x0)) {
    pxVar5 = extraout_RDX;
    for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
      if (p_Var1->ns == (xmlNs *)0x0) {
        iVar2 = xmlStrEqual(p_Var1->name,"id");
        pxVar5 = extraout_RDX_02;
        if (((iVar2 == 0) &&
            (iVar2 = xmlStrEqual(p_Var1->name,"namespace"), pxVar5 = extraout_RDX_03, iVar2 == 0))
           && (iVar2 = xmlStrEqual(p_Var1->name,(xmlChar *)"processContents"),
              pxVar5 = extraout_RDX_04, iVar2 == 0)) goto LAB_001b7fe7;
      }
      else {
        iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar5 = extraout_RDX_00;
        if (iVar2 != 0) {
LAB_001b7fe7:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar5,(xmlAttrPtr)pxVar4);
          pxVar5 = extraout_RDX_01;
        }
      }
    }
    xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar5);
    iVar2 = xmlSchemaParseWildcardNs(ctxt,schema_00,(xmlSchemaWildcardPtr)node,pxVar4);
    if (iVar2 == 0) {
      pxVar4 = node->children;
      if (pxVar4 == (xmlNodePtr)0x0) {
        return (xmlSchemaWildcardPtr)schema_00;
      }
      if (((pxVar4->ns != (xmlNs *)0x0) &&
          (iVar2 = xmlStrEqual(pxVar4->name,"annotation"), iVar2 != 0)) &&
         (iVar2 = xmlStrEqual(pxVar4->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar2 != 0)) {
        pxVar3 = xmlSchemaParseAnnotation(ctxt,pxVar4,1);
        schema_00->version = (xmlChar *)pxVar3;
        pxVar4 = pxVar4->next;
        if (pxVar4 == (_xmlNode *)0x0) {
          return (xmlSchemaWildcardPtr)schema_00;
        }
      }
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,pxVar4,
                 (xmlNodePtr)0x0,"(annotation?)",in_RAX);
      return (xmlSchemaWildcardPtr)schema_00;
    }
  }
  return (xmlSchemaWildcardPtr)0x0;
}

Assistant:

static xmlSchemaWildcardPtr
xmlSchemaParseAnyAttribute(xmlSchemaParserCtxtPtr ctxt,
                           xmlSchemaPtr schema, xmlNodePtr node)
{
    xmlSchemaWildcardPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    ret = xmlSchemaAddWildcard(ctxt, schema, XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
	node);
    if (ret == NULL) {
        return (NULL);
    }
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
	        (!xmlStrEqual(attr->name, BAD_CAST "namespace")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "processContents"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * Parse the namespace list.
    */
    if (xmlSchemaParseWildcardNs(ctxt, schema, ret, node) != 0)
	return (NULL);
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        ret->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?)");
    }

    return (ret);
}